

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

size_t phosg::skip_non_whitespace(string *s,size_t offset)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = s->_M_string_length;
  uVar3 = offset;
  if (offset < uVar1) {
    uVar3 = uVar1;
  }
  while ((uVar2 = uVar3, offset < uVar1 &&
         ((uVar4 = (ulong)(byte)(s->_M_dataplus)._M_p[offset], 0x20 < uVar4 ||
          (uVar2 = offset, (0x100002600U >> (uVar4 & 0x3f) & 1) == 0))))) {
    offset = offset + 1;
  }
  return uVar2;
}

Assistant:

size_t skip_non_whitespace(const string& s, size_t offset) {
  while (offset < s.length() &&
      (s[offset] != ' ' && s[offset] != '\t' && s[offset] != '\r' && s[offset] != '\n')) {
    offset++;
  }
  return offset;
}